

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O0

BasicHandleInfo * __thiscall
helics::HandleManager::getInterfaceHandle
          (HandleManager *this,InterfaceHandle handle,InterfaceType type)

{
  bool bVar1;
  reference pvVar2;
  InterfaceType in_DL;
  deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_> *in_RDI;
  value_type *hand;
  BaseType index;
  deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
  *in_stack_ffffffffffffffc8;
  InterfaceHandle local_c [3];
  
  InterfaceHandle::baseValue(local_c);
  bVar1 = isValidIndex<int,std::deque<helics::BasicHandleInfo,std::allocator<helics::BasicHandleInfo>>>
                    ((int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffc8);
  if (bVar1) {
    pvVar2 = std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::
             operator[](in_RDI,(size_type)in_stack_ffffffffffffffc8);
    bVar1 = interfaceTypeMatch(pvVar2->handleType,in_DL);
    if (bVar1) {
      return pvVar2;
    }
  }
  return (BasicHandleInfo *)0x0;
}

Assistant:

BasicHandleInfo* HandleManager::getInterfaceHandle(InterfaceHandle handle, InterfaceType type)
{
    auto index = handle.baseValue();
    if (isValidIndex(index, handles)) {
        auto& hand = handles[index];
        if (interfaceTypeMatch(hand.handleType, type)) {
            return &hand;
        }
    }

    return nullptr;
}